

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

void __thiscall
roaring::Roaring64Map::iterate(Roaring64Map *this,roaring_iterator64 iterator,void *ptr)

{
  _Bool _Var1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var2 != &(this->roarings)._M_t._M_impl.super__Rb_tree_header &&
         (_Var1 = roaring_iterate64((roaring_bitmap_t *)&p_Var2[1]._M_parent,
                                    (roaring_iterator64)iterator,(ulong)p_Var2[1]._M_color << 0x20,
                                    ptr), _Var1))) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  return;
}

Assistant:

void iterate(api::roaring_iterator64 iterator, void *ptr) const {
        for (const auto &map_entry : roarings) {
            bool should_continue =
                roaring_iterate64(&map_entry.second.roaring, iterator,
                                  uint64_t(map_entry.first) << 32, ptr);
            if (!should_continue) {
                break;
            }
        }
    }